

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::operator==
          (IFF_ATC_NAVAIDS_FundamentalParameterData *this,
          IFF_ATC_NAVAIDS_FundamentalParameterData *Value)

{
  IFF_ATC_NAVAIDS_FundamentalParameterData *Value_local;
  IFF_ATC_NAVAIDS_FundamentalParameterData *this_local;
  
  if (((float)this->m_f32ERP != (float)Value->m_f32ERP) ||
     (NAN((float)this->m_f32ERP) || NAN((float)Value->m_f32ERP))) {
    this_local._7_1_ = false;
  }
  else if (((float)this->m_f32Freq != (float)Value->m_f32Freq) ||
          (NAN((float)this->m_f32Freq) || NAN((float)Value->m_f32Freq))) {
    this_local._7_1_ = false;
  }
  else if (((float)this->m_f32PgRF != (float)Value->m_f32PgRF) ||
          (NAN((float)this->m_f32PgRF) || NAN((float)Value->m_f32PgRF))) {
    this_local._7_1_ = false;
  }
  else if (((float)this->m_f32PulseWidth != (float)Value->m_f32PulseWidth) ||
          (NAN((float)this->m_f32PulseWidth) || NAN((float)Value->m_f32PulseWidth))) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui32BurstLength == Value->m_ui32BurstLength) {
    if (this->m_ui8AppMode == Value->m_ui8AppMode) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL IFF_ATC_NAVAIDS_FundamentalParameterData::operator == ( const IFF_ATC_NAVAIDS_FundamentalParameterData & Value ) const
{
    if( m_f32ERP           != Value.m_f32ERP )           return false;
    if( m_f32Freq          != Value.m_f32Freq )          return false;
    if( m_f32PgRF          != Value.m_f32PgRF )          return false;
    if( m_f32PulseWidth    != Value.m_f32PulseWidth )    return false;
    if( m_ui32BurstLength  != Value.m_ui32BurstLength )  return false;
    if( m_ui8AppMode       != Value.m_ui8AppMode )       return false;
    return true;
}